

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int checkConstraintExprNode(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  
  if (pExpr->op == 0x9e) {
    if ((long)pExpr->iColumn < 0) {
      bVar1 = 2;
    }
    else {
      bVar1 = 1;
      if (*(int *)((long)&((pWalker->u).pNC)->pParse + (long)pExpr->iColumn * 4) < 0) {
        return 0;
      }
    }
    pWalker->eCode = pWalker->eCode | bVar1;
  }
  return 0;
}

Assistant:

static int checkConstraintExprNode(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN ){
    assert( pExpr->iColumn>=0 || pExpr->iColumn==-1 );
    if( pExpr->iColumn>=0 ){
      if( pWalker->u.aiCol[pExpr->iColumn]>=0 ){
        pWalker->eCode |= CKCNSTRNT_COLUMN;
      }
    }else{
      pWalker->eCode |= CKCNSTRNT_ROWID;
    }
  }
  return WRC_Continue;
}